

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O1

void __thiscall
TPZNonLinMultGridAnalysis::SmoothingSolution
          (TPZNonLinMultGridAnalysis *this,REAL tol,int numiter,TPZMaterial *matbase,
          TPZLinearAnalysis *an,int marcha,string *dxout)

{
  TPZFMatrix<double> *pTVar1;
  TPZFMatrix<std::complex<double>_> *pTVar2;
  ESolType EVar3;
  TPZCompMesh *CompMesh;
  TPZBaseMatrix *pTVar4;
  long *plVar5;
  ostream *poVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  TPZMaterial *local_80;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  
  if (matbase == (TPZMaterial *)0x0) {
    local_80 = (TPZMaterial *)0x0;
  }
  else {
    local_80 = (TPZMaterial *)
               __dynamic_cast(matbase,&TPZMaterial::typeinfo,&TPZMaterialT<double>::typeinfo,0);
  }
  if (numiter < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_2b10a27,0x3a);
    pTVar4 = (an->super_TPZAnalysis).fSolution.fBaseMatrix;
    if (pTVar4 != (TPZBaseMatrix *)0x0) {
      (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[0xf])();
      return;
    }
  }
  else {
    if (marcha != 0) {
      SmoothingSolution2(this,tol,numiter,local_80,an,marcha,dxout);
      return;
    }
    CompMesh = (an->super_TPZAnalysis).fCompMesh;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "PZAnalysis::SmoothingSolutionTest beginning of the iterative process\n",0x45);
    pTVar4 = (an->super_TPZAnalysis).fSolution.fBaseMatrix;
    if (pTVar4 != (TPZBaseMatrix *)0x0) {
      (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[0xf])();
    }
    SetDeltaTime(this,CompMesh,local_80);
    (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xb])(an,&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZNonLinMultGridAnalysis::SmoothingSolution iteration = ",
               0x39);
    plVar5 = (long *)std::ostream::operator<<(&std::cout,1);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    (**(code **)(*(long *)local_80 + 0xa0))(local_80,&local_58,0xffffffff);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    EVar3 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fSolType;
    if (EVar3 == EComplex) {
      pTVar2 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fComplexMatrix;
      Dot<std::complex<double>>(pTVar2,pTVar2);
      dVar9 = extraout_XMM0_Qa;
    }
    else {
      if (EVar3 != EReal) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"STATE Norm(const TPZSolutionMatrix &)",0x25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Type is not set. Aborting...\n",0x1d);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.h"
                   ,0x98);
      }
      pTVar1 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fRealMatrix;
      dVar9 = Dot<double>(pTVar1,pTVar1);
    }
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    bVar8 = numiter != 1;
    if ((bVar8) && (dVar9 < tol)) {
      pTVar2 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fComplexMatrix;
      pTVar1 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fRealMatrix;
      iVar7 = 2;
      do {
        pTVar4 = (an->super_TPZAnalysis).fSolution.fBaseMatrix;
        if (pTVar4 != (TPZBaseMatrix *)0x0) {
          (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[0xf])();
        }
        SetDeltaTime(this,CompMesh,local_80);
        (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xb])(an,&std::cout);
        (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = ",
                   0x38);
        plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar7);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
        EVar3 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution.fSolType;
        if (EVar3 == EComplex) {
          Dot<std::complex<double>>(pTVar2,pTVar2);
          dVar9 = extraout_XMM0_Qa_00;
        }
        else {
          if (EVar3 != EReal) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"STATE Norm(const TPZSolutionMatrix &)",0x25);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Type is not set. Aborting...\n",0x1d);
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.h"
                       ,0x98);
          }
          dVar9 = Dot<double>(pTVar1,pTVar1);
        }
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        bVar8 = iVar7 < numiter;
        if (numiter <= iVar7) break;
        iVar7 = iVar7 + 1;
      } while (dVar9 < tol);
    }
    if (bVar8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped",0x4b
                );
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," due the great norm of the solution, norm solution = ",0x35)
      ;
      poVar6 = std::ostream::_M_insert<double>(dVar9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
  }
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::SmoothingSolution(REAL tol,int numiter,TPZMaterial * matbase,
												  TPZLinearAnalysis &an,int marcha,const std::string &dxout) {
	auto *mat =
		dynamic_cast<TPZMaterialT<STATE>*>(matbase);
	if(numiter <= 0){
		cout << "PZAnalysis::SmoothingSolution NENHUMA RESOLU�O EFETUADA\n";
		an.Solution().Zero();
		return;
	}
	if(marcha){
		//saida com o DX
		SmoothingSolution2(tol,numiter,mat,an,marcha,dxout);
		return;
	}
	TPZCompMesh *anmesh = an.Mesh();
	cout << "PZAnalysis::SmoothingSolutionTest beginning of the iterative process\n";
	int iter = 0;
	an.Solution().Zero();
	SetDeltaTime(anmesh,mat);
	an.Run();
	cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteration = " << ++iter << endl;
	an.LoadSolution();
	mat->SetForcingFunction(nullptr,-1);
	REAL normsol = Norm(Solution());
	
	while(iter < numiter && normsol < tol) {
		
		an.Solution().Zero();
		SetDeltaTime(anmesh,mat);
		an.Run();
		an.LoadSolution();
		cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = " << ++iter << endl;
		normsol = Norm(Solution());
	}
	if(iter < numiter){
		cout << "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped"
		<< " due the great norm of the solution, norm solution = " << normsol << endl;
	}
	an.LoadSolution();
}